

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O2

void __thiscall DrawerCommandQueue::~DrawerCommandQueue(DrawerCommandQueue *this)

{
  StopThreads(this);
  std::thread::~thread(&(this->single_core_thread).thread);
  FString::~FString(&this->thread_error);
  std::condition_variable::~condition_variable(&this->end_condition);
  std::_Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::~_Vector_base
            (&(this->active_commands).
              super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>);
  std::condition_variable::~condition_variable(&this->start_condition);
  std::vector<DrawerThread,_std::allocator<DrawerThread>_>::~vector(&this->threads);
  std::_Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::~_Vector_base
            (&(this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>
            );
  return;
}

Assistant:

DrawerCommandQueue::~DrawerCommandQueue()
{
	StopThreads();
}